

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O2

void __thiscall Memory::XDataAllocator::ClearFreeList(XDataAllocator *this)

{
  XDataAllocationEntry *pXVar1;
  XDataAllocationEntry *obj;
  
  obj = this->freeList;
  while (obj != (XDataAllocationEntry *)0x0) {
    pXVar1 = obj->next;
    (obj->super_XDataAllocation).super_SecondaryAllocation.address = (BYTE *)0x0;
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::XDataAllocator::XDataAllocationEntry>
              (&HeapAllocator::Instance,obj);
    obj = pXVar1;
  }
  this->freeList = (XDataAllocationEntry *)0x0;
  return;
}

Assistant:

void XDataAllocator::ClearFreeList()
{
    XDataAllocationEntry* next = this->freeList;
    XDataAllocationEntry* entry;
    while(next)
    {
        entry = next;
        next = entry->next;
        entry->address = nullptr;
        HeapDelete(entry);
    }
    this->freeList = NULL;
}